

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O1

void ecs_bulk_delete(ecs_world_t *world,ecs_filter_t *filter)

{
  ecs_vector_t *vector;
  _Bool _Var1;
  int32_t iVar2;
  uint uVar3;
  ecs_stage_t *peVar4;
  ecs_table_t *table;
  ecs_data_t *peVar5;
  void *pvVar6;
  ulong uVar7;
  int dense_index;
  ecs_world_t *local_40;
  ecs_filter_t *local_38;
  
  local_40 = world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xd);
  if (local_40 == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,0xd,"void bulk_delete(ecs_world_t *, const ecs_filter_t *, _Bool)");
  }
  peVar4 = ecs_get_stage(&local_40);
  _ecs_assert(peVar4 == &local_40->stage,0x23,(char *)0x0,"stage == &world->stage",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xf);
  if (peVar4 == &local_40->stage) {
    iVar2 = ecs_sparse_count((local_40->store).tables);
    if (0 < iVar2) {
      dense_index = 0;
      local_38 = filter;
      do {
        table = (ecs_table_t *)_ecs_sparse_get((local_40->store).tables,0x80,dense_index);
        if ((table->flags & 1) == 0) {
          _Var1 = ecs_table_match_filter(local_40,table,filter);
          if (_Var1) {
            peVar5 = ecs_table_get_data(table);
            if (peVar5 != (ecs_data_t *)0x0) {
              vector = peVar5->entities;
              uVar3 = ecs_vector_count(vector);
              pvVar6 = _ecs_vector_first(vector,8,0x10);
              if (0 < (int)uVar3) {
                uVar7 = 0;
                do {
                  ecs_sparse_remove((local_40->store).entity_index,
                                    *(uint64_t *)((long)pvVar6 + uVar7 * 8));
                  uVar7 = uVar7 + 1;
                } while (uVar3 != uVar7);
              }
              ecs_table_clear(local_40,table);
              filter = local_38;
            }
          }
        }
        dense_index = dense_index + 1;
      } while (dense_index != iVar2);
    }
    return;
  }
  __assert_fail("stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xf,"void bulk_delete(ecs_world_t *, const ecs_filter_t *, _Bool)");
}

Assistant:

void ecs_bulk_delete(
    ecs_world_t *world,
    const ecs_filter_t *filter)
{
    bulk_delete(world, filter, true);
}